

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O1

RC __thiscall QL_NodeProj::SetUpNode(QL_NodeProj *this,int numAttrToKeep)

{
  int *piVar1;
  char *pcVar2;
  int bufLength;
  int local_1c;
  
  piVar1 = (int *)malloc((long)numAttrToKeep << 2);
  (this->super_QL_Node).attrsInRec = piVar1;
  piVar1[0] = 0;
  piVar1[1] = 0;
  QL_Node::GetTupleLength(this->prevNode,&local_1c);
  pcVar2 = (char *)malloc((long)local_1c);
  this->buffer = pcVar2;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  (this->super_QL_Node).listsInitialized = true;
  return 0;
}

Assistant:

RC QL_NodeProj::SetUpNode(int numAttrToKeep){
  RC rc = 0;
  // malloc the list of attributes to keep
  attrsInRec = (int *)malloc(numAttrToKeep * sizeof(int));
  memset((void*)attrsInRec, 0, sizeof(attrsInRec));
  int attrsInRecSize = 0;

  // malloc the buffer to keep the data for a tuple passed
  // up from the previous node
  int bufLength;
  prevNode.GetTupleLength(bufLength);
  buffer = (char *)malloc(bufLength);
  memset((void*) buffer, 0, sizeof(buffer));
  listsInitialized = true;

  return (0);
}